

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowAggFinal(Parse *pParse,Window *pMWin,int bFinal)

{
  int iVar1;
  int iVar2;
  Vdbe *p;
  Window *local_30;
  Window *pWin;
  Vdbe *v;
  int bFinal_local;
  Window *pMWin_local;
  Parse *pParse_local;
  
  p = sqlite3GetVdbe(pParse);
  for (local_30 = pMWin; local_30 != (Window *)0x0; local_30 = local_30->pNextWin) {
    if (((local_30->pFunc->funcFlags & 0x1000) == 0) || (local_30->eStart == 'W')) {
      if (local_30->regApp == 0) {
        if (bFinal == 0) {
          iVar1 = local_30->regAccum;
          iVar2 = windowArgCount(local_30);
          sqlite3VdbeAddOp3(p,0x9d,iVar1,iVar2,local_30->regResult);
          sqlite3VdbeAppendP4(p,local_30->pFunc,-8);
        }
        else {
          iVar1 = local_30->regAccum;
          iVar2 = windowArgCount(local_30);
          sqlite3VdbeAddOp2(p,0x9e,iVar1,iVar2);
          sqlite3VdbeAppendP4(p,local_30->pFunc,-8);
          sqlite3VdbeAddOp2(p,0x4e,local_30->regAccum,local_30->regResult);
          sqlite3VdbeAddOp2(p,0x49,0,local_30->regAccum);
        }
      }
    }
    else {
      sqlite3VdbeAddOp2(p,0x49,0,local_30->regResult);
      sqlite3VdbeAddOp1(p,0x20,local_30->csrApp);
      sqlite3VdbeAddOp3(p,0x5a,local_30->csrApp,0,local_30->regResult);
      iVar1 = sqlite3VdbeCurrentAddr(p);
      sqlite3VdbeJumpHere(p,iVar1 + -2);
      if (bFinal != 0) {
        sqlite3VdbeAddOp1(p,0x8b,local_30->csrApp);
      }
    }
  }
  return;
}

Assistant:

static void windowAggFinal(Parse *pParse, Window *pMWin, int bFinal){
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;

  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    if( (pWin->pFunc->funcFlags & SQLITE_FUNC_MINMAX) 
     && pWin->eStart!=TK_UNBOUNDED 
    ){
      sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regResult);
      sqlite3VdbeAddOp1(v, OP_Last, pWin->csrApp);
      VdbeCoverage(v);
      sqlite3VdbeAddOp3(v, OP_Column, pWin->csrApp, 0, pWin->regResult);
      sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      if( bFinal ){
        sqlite3VdbeAddOp1(v, OP_ResetSorter, pWin->csrApp);
      }
    }else if( pWin->regApp ){
    }else{
      if( bFinal ){
        sqlite3VdbeAddOp2(v, OP_AggFinal, pWin->regAccum, windowArgCount(pWin));
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
        sqlite3VdbeAddOp2(v, OP_Copy, pWin->regAccum, pWin->regResult);
        sqlite3VdbeAddOp2(v, OP_Null, 0, pWin->regAccum);
      }else{
        sqlite3VdbeAddOp3(v, OP_AggValue, pWin->regAccum, windowArgCount(pWin),
                             pWin->regResult);
        sqlite3VdbeAppendP4(v, pWin->pFunc, P4_FUNCDEF);
      }
    }
  }
}